

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O3

vector<Image,_std::allocator<Image>_> *
LoadSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ReadBinaryFile(&local_28,filename);
  if (*(int *)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0xe000e) {
    anon_unknown.dwarf_4ebc::LoadCgaSpritesheet(__return_storage_ptr__,&local_28);
  }
  else if (*(int *)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start == 0xe001d) {
    anon_unknown.dwarf_4ebc::LoadEgaSpritesheet(__return_storage_ptr__,&local_28);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if ((int *)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  if (memcmp(data.data(), cga_header.data(), cga_header.size()) == 0) {
    return LoadCgaSpritesheet(data);
  }
  if (memcmp(data.data(), ega_header.data(), ega_header.size()) == 0) {
    return LoadEgaSpritesheet(data);
  }
  return {};
}